

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t rar5_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  wchar_t *pwVar1;
  file_header *pfVar2;
  undefined1 *puVar3;
  int64_t *piVar4;
  char cVar5;
  compressed_block_header cVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  size_t __size;
  rar5 *rar;
  uint8_t *puVar10;
  archive_read *paVar11;
  uint16_t uVar12;
  wchar_t wVar13;
  uint32_t uVar14;
  int iVar15;
  wchar_t wVar16;
  size_t sVar17;
  uint8_t *puVar18;
  compressed_block_header *p;
  void *__src;
  rar5 *prVar19;
  uint *puVar20;
  int64_t iVar21;
  byte bVar22;
  byte bVar23;
  ushort uVar24;
  uint32_t uVar25;
  long lVar26;
  long lVar27;
  rar5 *prVar28;
  uint8_t uVar29;
  char *pcVar30;
  uint uVar31;
  size_t min;
  long lVar32;
  rar5 *prVar33;
  ulong uVar34;
  ulong uVar35;
  decode_table *pdVar36;
  uint uVar37;
  wchar_t wVar38;
  rar5 *prVar39;
  ulong uVar40;
  size_t sVar41;
  bool bVar42;
  uint16_t num_1;
  uint16_t filter_type;
  uint16_t num;
  uint8_t bit_length [20];
  uint8_t table [430];
  ushort local_284;
  ushort uStack_282;
  archive_read *local_280;
  rar5 *local_278;
  uint8_t *local_270;
  ulong uStack_268;
  uint *local_260;
  rar5 *local_258;
  wchar_t local_24c;
  size_t local_248;
  wchar_t local_23c;
  ulong local_238;
  rar5 *local_230;
  decode_table *local_228;
  rar5 *local_220;
  uint local_218 [8];
  decode_table *local_1f8;
  decode_table *local_1f0;
  ulong local_1e8 [38];
  uint8_t local_b6 [64];
  uint8_t local_76 [16];
  uint8_t local_66 [54];
  
  local_230 = (rar5 *)a->format->data;
  if (size != (size_t *)0x0) {
    *size = 0;
  }
  if (((local_230->file).field_0x20 & 8) != 0) {
    archive_set_error(&a->archive,0x54,"Can\'t decompress an entry marked as a directory");
    return L'\xffffffe7';
  }
  if ((local_230->skip_mode == L'\0') &&
     ((local_230->file).unpacked_size < (local_230->cstate).last_write_ptr)) {
    archive_set_error(&a->archive,0x16,"Unpacker has written too many bytes");
    return L'\xffffffe2';
  }
  lVar26 = 0x4b68;
  do {
    cVar5 = *(char *)((long)&local_230->header_initialized + lVar26);
    if (cVar5 != '\0') {
      if (buff != (void **)0x0) {
        *buff = *(void **)((long)&local_230->skip_mode + lVar26);
      }
      if (size != (size_t *)0x0) {
        *size = *(size_t *)((long)&local_230->qlist_offset + lVar26);
      }
      if (offset != (int64_t *)0x0) {
        *offset = *(int64_t *)((long)&local_230->rr_offset + lVar26);
      }
      *(undefined1 *)((long)&local_230->header_initialized + lVar26) = 0;
      break;
    }
    lVar26 = lVar26 + 0x20;
  } while (lVar26 == 0x4b88);
  if (cVar5 != '\0') {
    return L'\0';
  }
  bVar22 = (local_230->file).field_0x20;
  if ((bVar22 & 4) != 0) {
    return L'\x01';
  }
  if ((bVar22 & 2) == 0) {
    wVar16 = (local_230->cstate).method;
    paVar11 = a;
    if ((uint)(wVar16 + L'\xffffffff') < 5) {
      do {
        local_280 = paVar11;
        prVar19 = (rar5 *)a->format->data;
        if ((undefined1  [19312])((undefined1  [19312])prVar19->cstate & (undefined1  [19312])0x1)
            == (undefined1  [19312])0x0) {
          if ((((ulong)prVar19->main & 1) == 0) || ((prVar19->cstate).window_buf == (uint8_t *)0x0))
          {
            (prVar19->file).calculated_crc32 = 0;
            lVar26 = (prVar19->cstate).window_size;
            sVar17 = lVar26 - 1;
            if (lVar26 == 0) {
              sVar17 = 0;
            }
            (prVar19->cstate).window_mask = sVar17;
            free((prVar19->cstate).window_buf);
            free((prVar19->cstate).filtered_buf);
            __size = (prVar19->cstate).window_size;
            if ((long)__size < 1) {
              (prVar19->cstate).window_buf = (uint8_t *)0x0;
              puVar18 = (uint8_t *)0x0;
            }
            else {
              puVar18 = (uint8_t *)calloc(1,__size);
              (prVar19->cstate).window_buf = puVar18;
              puVar18 = (uint8_t *)calloc(1,__size);
            }
            (prVar19->cstate).filtered_buf = puVar18;
            (prVar19->cstate).write_ptr = 0;
            (prVar19->cstate).last_write_ptr = 0;
            memset(&(prVar19->cstate).bd,0,0x4a9c);
          }
          *(byte *)&prVar19->cstate = *(byte *)&prVar19->cstate | 1;
        }
        if ((prVar19->cstate).window_size == 0) {
          archive_set_error(&a->archive,0x54,"Invalid window size declaration in this file");
LAB_00155e10:
          wVar16 = L'\xffffffe2';
        }
        else {
          local_220 = prVar19;
          if ((undefined1  [19312])((undefined1  [19312])prVar19->cstate & (undefined1  [19312])0x2)
              != (undefined1  [19312])0x0) {
            do {
              prVar19 = (rar5 *)a->format->data;
              if (((((ulong)prVar19->main & 2) == 0) || ((prVar19->file).bytes_remaining != 0)) ||
                 (wVar16 = advance_multivolume(a), wVar16 == L'\0')) {
                local_278 = prVar19;
                if ((undefined1  [19312])
                    ((undefined1  [19312])prVar19->cstate & (undefined1  [19312])0x8) ==
                    (undefined1  [19312])0x0) {
                  p = (compressed_block_header *)(prVar19->cstate).block_buf;
                }
                else {
                  local_1e8[0] = 0xffffffffffffffff;
                  p = (compressed_block_header *)__archive_read_ahead(a,6,(ssize_t *)local_1e8);
                  wVar13 = L'\x01';
                  wVar16 = wVar13;
                  if (p == (compressed_block_header *)0x0) {
LAB_001555b0:
                    bVar42 = false;
                  }
                  else {
                    cVar6 = *p;
                    prVar19->last_block_hdr = cVar6;
                    uVar24 = (ushort)cVar6 >> 3 & 7;
                    bVar22 = (byte)uVar24;
                    if (bVar22 < 3) {
                      wVar16 = L'\xffffffe2';
                      if (bVar22 == 2) {
                        local_248 = (ulong)((uint)p[1].block_cksum << 8 |
                                           (uint)p[2].block_flags_u8 << 0x10) |
                                    (ulong)p[1].block_flags_u8;
                      }
                      else if (uVar24 == 1) {
                        local_248 = (size_t)(ushort)p[1];
                      }
                      else {
                        if (((ushort)cVar6 >> 3 & 7) != 0) {
                          local_248 = 0;
                          bVar42 = false;
                          goto LAB_00154ef6;
                        }
                        local_248 = (size_t)p[1].block_flags_u8;
                      }
                      if ((((uint)(local_248 >> 0x10) ^ (uint)local_248 ^
                            (uint)(local_248 >> 8) ^ (uint)cVar6.block_flags_u8 ^ 0x5a) & 0xff) ==
                          (uint)(local_278->last_block_hdr).block_cksum) {
                        wVar16 = L'\0';
                        bVar42 = true;
                      }
                      else {
                        bVar42 = false;
                        archive_set_error(&local_280->archive,0x54,
                                          "Block checksum error: got 0x%x, expected 0x%x");
                      }
                    }
                    else {
                      bVar42 = false;
                      archive_set_error(&a->archive,0x54,
                                        "Unsupported block header size (was %d, max is 2)");
                      wVar16 = L'\xffffffe2';
                    }
LAB_00154ef6:
                    prVar19 = local_278;
                    a = local_280;
                    if (bVar42) {
                      lVar26 = (ulong)((local_278->last_block_hdr).block_flags_u8 >> 3 & 7) + 3;
                      iVar21 = __archive_read_consume(local_280,lVar26);
                      wVar16 = wVar13;
                      if (iVar21 != lVar26) goto LAB_001555b0;
                      lVar26 = (prVar19->file).bytes_remaining - lVar26;
                      (prVar19->file).bytes_remaining = lVar26;
                      if (lVar26 < (long)local_248) {
                        prVar28 = (rar5 *)a->format->data;
                        if (prVar28->merge_mode == L'\0') {
                          *(byte *)&prVar28->cstate = *(byte *)&prVar28->cstate | 4;
                          puVar18 = (prVar28->vol).push_buf;
                          local_258 = prVar28;
                          if (puVar18 != (uint8_t *)0x0) {
                            free(puVar18);
                          }
                          sVar17 = local_248;
                          puVar18 = (uint8_t *)malloc(local_248 + 8);
                          (local_258->vol).push_buf = puVar18;
                          if (puVar18 == (uint8_t *)0x0) {
                            iVar15 = 0xc;
                            pcVar30 = "Can\'t allocate memory for a merge block buffer.";
                            goto LAB_00154f66;
                          }
                          puVar18 = puVar18 + sVar17;
                          puVar18[0] = '\0';
                          puVar18[1] = '\0';
                          puVar18[2] = '\0';
                          puVar18[3] = '\0';
                          puVar18[4] = '\0';
                          puVar18[5] = '\0';
                          puVar18[6] = '\0';
                          puVar18[7] = '\0';
                          min = (local_258->file).bytes_remaining;
                          if ((long)sVar17 <= (long)min) {
                            min = sVar17;
                          }
                          if (min != 0) {
                            puVar18 = (uint8_t *)0x0;
                            do {
                              local_1e8[0] = 0xffffffffffffffff;
                              __src = __archive_read_ahead(a,min,(ssize_t *)local_1e8);
                              prVar28 = local_258;
                              wVar13 = L'\x01';
                              prVar19 = local_278;
                              if (__src == (void *)0x0) goto LAB_00155128;
                              if ((long)local_248 < (long)(puVar18 + min)) {
                                iVar15 = 0x16;
                                pcVar30 = "Consumed too much data when merging blocks.";
                                a = local_280;
                                goto LAB_00155111;
                              }
                              local_270 = puVar18 + min;
                              memcpy(puVar18 + (long)(local_258->vol).push_buf,__src,min);
                              sVar17 = __archive_read_consume(local_280,min);
                              a = local_280;
                              prVar19 = local_278;
                              if (sVar17 != min) goto LAB_00155128;
                              sVar17 = (prVar28->file).bytes_remaining;
                              (prVar28->file).bytes_remaining = sVar17 - min;
                              sVar41 = local_248 - (long)local_270;
                              if (sVar41 == 0) {
                                p = (compressed_block_header *)(prVar28->vol).push_buf;
                                wVar13 = L'\0';
                                goto LAB_00155128;
                              }
                              if (sVar17 == min) {
                                prVar28->merge_mode = prVar28->merge_mode + L'\x01';
                                wVar13 = advance_multivolume(local_280);
                                local_258->merge_mode = local_258->merge_mode + L'\xffffffff';
                                prVar28 = local_258;
                                a = local_280;
                                prVar19 = local_278;
                                if (wVar13 != L'\0') goto LAB_00155128;
                              }
                              sVar17 = (prVar28->file).bytes_remaining;
                              min = sVar41;
                              if ((long)sVar17 < (long)sVar41) {
                                min = sVar17;
                              }
                              a = local_280;
                              puVar18 = local_270;
                            } while (min != 0);
                          }
                          iVar15 = 0x54;
                          pcVar30 = "Encountered block size == 0 during block merge";
LAB_00155111:
                          archive_set_error(&a->archive,iVar15,pcVar30);
                          wVar13 = L'\xffffffe2';
                          prVar19 = local_278;
                        }
                        else {
                          iVar15 = 0x16;
                          pcVar30 = "Recursive merge is not allowed";
LAB_00154f66:
                          archive_set_error(&a->archive,iVar15,pcVar30);
                          wVar13 = L'\xffffffe2';
                        }
LAB_00155128:
                        wVar16 = wVar13;
                        if (wVar13 != L'\0') goto LAB_001555b0;
                      }
                      else {
                        *(byte *)&prVar19->cstate = *(byte *)&prVar19->cstate & 0xfb;
                        local_1e8[0] = 0xffffffffffffffff;
                        p = (compressed_block_header *)
                            __archive_read_ahead(a,local_248 + 4,(ssize_t *)local_1e8);
                        if (p == (compressed_block_header *)0x0) goto LAB_001555b0;
                      }
                      (prVar19->cstate).block_buf = &p->block_flags_u8;
                      (prVar19->cstate).cur_block_size = local_248;
                      *(byte *)&prVar19->cstate = *(byte *)&prVar19->cstate & 0xf7;
                      (prVar19->bits).in_addr = L'\0';
                      (prVar19->bits).bit_addr = '\0';
                      wVar16 = wVar13;
                      if ((char)(prVar19->last_block_hdr).block_flags_u8 < '\0') {
                        iVar15 = 0;
                        bVar22 = 4;
                        wVar38 = L'\0';
                        wVar13 = L'ð';
                        do {
                          if ((long)local_248 <= (long)wVar38) {
                            archive_set_error(&a->archive,0x54,"Truncated data in huffman tables");
                            wVar16 = L'\xffffffe2';
                            goto LAB_001555a2;
                          }
                          uVar37 = (uint)((uint)(&p->block_flags_u8)[wVar38] & wVar13) >> bVar22;
                          wVar38 = wVar38 + (uint)(wVar13 == L'\x0f');
                          wVar16 = wVar13 ^ 0xff;
                          bVar23 = bVar22 ^ 4;
                          if (uVar37 == 0xf) {
                            uVar37 = wVar16 & (uint)(&p->block_flags_u8)[wVar38];
                            wVar38 = wVar38 + (uint)(wVar13 == L'ð');
                            wVar16 = wVar13;
                            if (uVar37 >> bVar23 == 0) {
                              lVar26 = (long)iVar15;
                              iVar15 = iVar15 + 1;
                              *(undefined1 *)((long)local_218 + lVar26) = 0xf;
                            }
                            else if (iVar15 < 0x14) {
                              local_270 = (uint8_t *)(long)iVar15;
                              uVar31 = (uVar37 >> bVar23) + 1;
                              uVar37 = 0x13U - iVar15;
                              if (uVar31 < 0x13U - iVar15) {
                                uVar37 = uVar31;
                              }
                              memset((uint8_t *)((long)local_218 + (long)local_270),0,
                                     (ulong)(uVar37 + 1));
                              uVar40 = 0x13U - (long)local_270;
                              if ((ulong)uVar31 <= 0x13U - (long)local_270) {
                                uVar40 = (ulong)uVar31;
                              }
                              iVar15 = iVar15 + (int)uVar40 + 1;
                            }
                          }
                          else {
                            lVar26 = (long)iVar15;
                            iVar15 = iVar15 + 1;
                            *(char *)((long)local_218 + lVar26) = (char)uVar37;
                            bVar22 = bVar23;
                          }
                          prVar19 = local_278;
                          a = local_280;
                          wVar13 = wVar16;
                        } while (iVar15 < 0x14);
                        (local_278->bits).in_addr = wVar38;
                        (local_278->bits).bit_addr = bVar22 ^ 4;
                        pdVar36 = &(local_278->cstate).bd;
                        create_decode_tables((uint8_t *)local_218,pdVar36,L'\x14');
                        uVar37 = 0;
                        do {
                          if (0x1ad < (int)uVar37) {
                            create_decode_tables((uint8_t *)local_1e8,&(prVar19->cstate).ld,L'Ĳ');
                            create_decode_tables(local_b6,&(prVar19->cstate).dd,L'@');
                            create_decode_tables(local_76,&(prVar19->cstate).ldd,L'\x10');
                            create_decode_tables(local_66,&(prVar19->cstate).rd,L',');
                            wVar16 = L'\0';
                            break;
                          }
                          wVar13 = decode_number(a,pdVar36,&p->block_flags_u8,(uint16_t *)&local_23c
                                                );
                          if (wVar13 != L'\0') {
                            bVar42 = false;
                            archive_set_error(&a->archive,0x54,"Decoding huffman tables failed");
                            wVar16 = L'\xffffffe2';
                            goto LAB_001552dd;
                          }
                          uVar24 = (ushort)local_23c;
                          if ((ushort)local_23c < 0x10) {
                            *(char *)((long)local_1e8 + (long)(int)uVar37) = (char)local_23c;
                            uVar37 = uVar37 + 1;
LAB_001552db:
                            bVar42 = true;
                          }
                          else if ((ushort)local_23c < 0x12) {
                            wVar13 = read_bits_16(local_280,prVar19,&p->block_flags_u8,&uStack_282);
                            if (wVar13 == L'\0') {
                              uVar7 = uStack_282 >> 9;
                              uStack_282 = (uStack_282 >> 0xd) + 3;
                              if (uVar24 != 0x10) {
                                uStack_282 = uVar7 + 0xb;
                              }
                              iVar15 = (int)(prVar19->bits).bit_addr + (uint)(uVar24 != 0x10) * 4 +
                                       3;
                              pwVar1 = &(prVar19->bits).in_addr;
                              *pwVar1 = *pwVar1 + (iVar15 >> 3);
                              (prVar19->bits).bit_addr = (byte)iVar15 & 7;
                              if ((int)uVar37 < 1) {
                                bVar42 = false;
                                archive_set_error(&local_280->archive,0x54,
                                                  "Unexpected error when decoding huffman tables");
                                wVar16 = L'\xffffffe2';
                              }
                              else {
                                bVar42 = uStack_282 != 0;
                                uStack_282 = uStack_282 - 1;
                                if (bVar42) {
                                  uVar40 = (ulong)uVar37;
                                  iVar15 = uVar37 - 1;
                                  lVar26 = 0;
                                  uVar31 = uVar37;
                                  do {
                                    *(undefined1 *)((long)local_1e8 + lVar26 + uVar40) =
                                         *(undefined1 *)
                                          ((long)local_1e8 + (ulong)(uint)(iVar15 + (int)lVar26));
                                    uVar24 = (ushort)lVar26;
                                    uVar37 = uVar31 + 1;
                                    lVar26 = lVar26 + 1;
                                    if (uStack_282 == uVar24) break;
                                    bVar42 = (int)uVar31 < 0x1ad;
                                    uVar31 = uVar37;
                                  } while (bVar42);
                                  uStack_282 = uStack_282 - (short)lVar26;
                                }
                                bVar42 = true;
                              }
                            }
                            else {
                              bVar42 = false;
                              wVar16 = wVar13;
                            }
                            if (bVar42) goto LAB_001552db;
                            bVar42 = false;
                          }
                          else {
                            wVar38 = read_bits_16(local_280,prVar19,&p->block_flags_u8,&uStack_282);
                            wVar13 = wVar38;
                            if (wVar38 == L'\0') {
                              uVar12 = (uStack_282 >> 0xd) + 3;
                              if (uVar24 != 0x12) {
                                uVar12 = (uStack_282 >> 9) + 0xb;
                              }
                              iVar15 = (int)(prVar19->bits).bit_addr + (uint)(uVar24 != 0x12) * 4 +
                                       3;
                              pwVar1 = &(prVar19->bits).in_addr;
                              *pwVar1 = *pwVar1 + (iVar15 >> 3);
                              (prVar19->bits).bit_addr = (byte)iVar15 & 7;
                              uStack_282 = uVar12 - 1;
                              wVar13 = wVar16;
                              if (uVar12 != 0) {
                                local_270 = (uint8_t *)(long)(int)uVar37;
                                uVar31 = 0x1ad;
                                if (0x1ad < (int)uVar37) {
                                  uVar31 = uVar37;
                                }
                                local_258 = (rar5 *)(ulong)uStack_282;
                                prVar19 = (rar5 *)(ulong)(uVar31 - uVar37);
                                if (local_258 <= (rar5 *)(ulong)(uVar31 - uVar37)) {
                                  prVar19 = local_258;
                                }
                                uStack_282 = uVar12;
                                memset((uint8_t *)((long)local_1e8 + (long)local_270),0,
                                       (size_t)((long)&prVar19->header_initialized + 1));
                                puVar18 = (uint8_t *)0x1ad;
                                if (0x1ad < (long)local_270) {
                                  puVar18 = local_270;
                                }
                                prVar19 = (rar5 *)(puVar18 + -(long)local_270);
                                if (local_258 <= (rar5 *)(puVar18 + -(long)local_270)) {
                                  prVar19 = local_258;
                                }
                                uStack_282 = (uVar12 - (short)prVar19) - 2;
                                uVar37 = uVar37 + (int)prVar19 + 1;
                              }
                            }
                            wVar16 = wVar13;
                            prVar19 = local_278;
                            if (wVar38 == L'\0') goto LAB_001552db;
                            bVar42 = false;
                          }
LAB_001552dd:
                          a = local_280;
                        } while (bVar42);
LAB_001555a2:
                        if (wVar16 != L'\0') goto LAB_001555b0;
                      }
                      bVar42 = true;
                    }
                    else {
                      bVar42 = false;
                    }
                  }
                  if (!bVar42) goto LAB_00155d22;
                }
                prVar19 = (rar5 *)a->format->data;
                if ((prVar19->cstate).write_ptr - (prVar19->cstate).last_write_ptr <=
                    (prVar19->cstate).window_size >> 1) {
                  local_258 = (rar5 *)(prVar19->cstate).window_mask;
                  local_270 = (uint8_t *)
                              (CONCAT71(local_270._1_7_,(prVar19->last_block_hdr).block_flags_u8) &
                              0xffffffffffffff07);
                  local_1f0 = &(prVar19->cstate).rd;
                  local_228 = &(prVar19->cstate).dd;
                  local_1f8 = &(prVar19->cstate).ldd;
                  do {
                    while( true ) {
                      lVar27 = (long)(prVar19->bits).in_addr;
                      lVar26 = (prVar19->cstate).cur_block_size;
                      if ((lVar26 <= lVar27) ||
                         ((lVar26 + -1 == lVar27 && ((char)local_270 < (prVar19->bits).bit_addr))))
                      {
                        *(byte *)&prVar19->cstate = *(byte *)&prVar19->cstate | 8;
                        goto LAB_00155d1a;
                      }
                      wVar16 = decode_number(a,&(prVar19->cstate).ld,&p->block_flags_u8,&local_284);
                      if (wVar16 != L'\0') {
                        wVar16 = L'\x01';
                        goto LAB_00155d1d;
                      }
                      if (0xff < local_284) break;
                      lVar26 = (prVar19->cstate).write_ptr;
                      (prVar19->cstate).write_ptr = lVar26 + 1;
                      (prVar19->cstate).window_buf
                      [lVar26 + (prVar19->cstate).solid_offset & (ulong)local_258] =
                           (uint8_t)local_284;
LAB_00155745:
                      if ((prVar19->cstate).window_size >> 1 <
                          (prVar19->cstate).write_ptr - (prVar19->cstate).last_write_ptr)
                      goto LAB_00155d1a;
                    }
                    uVar37 = (uint)local_284;
                    if (uVar37 < 0x106) {
                      if (local_284 == 0x101) {
                        wVar16 = (prVar19->cstate).last_len;
                        if ((wVar16 == L'\0') ||
                           (wVar16 = copy_string(a,wVar16,(prVar19->cstate).dist_cache[0]),
                           wVar16 == L'\0')) goto LAB_00155745;
                        wVar16 = L'\xffffffe2';
                      }
                      else {
                        if (uVar37 != 0x100) {
                          wVar16 = (prVar19->cstate).dist_cache[uVar37 - 0x102];
                          uVar40 = (ulong)(uVar37 - 0x102);
                          if (0x102 < local_284) {
                            do {
                              (prVar19->cstate).dist_cache[uVar40] =
                                   (prVar19->cstate).dist_cache[uVar40 - 1];
                              bVar42 = 1 < (long)uVar40;
                              uVar40 = uVar40 - 1;
                            } while (bVar42);
                          }
                          (prVar19->cstate).dist_cache[0] = wVar16;
                          wVar13 = decode_number(a,local_1f0,&p->block_flags_u8,
                                                 (uint16_t *)local_1e8);
                          if (wVar13 == L'\0') {
                            wVar13 = decode_code_length(a,prVar19,&p->block_flags_u8,
                                                        (uint16_t)local_1e8[0]);
                            if (wVar13 != L'\xffffffff') {
                              (prVar19->cstate).last_len = wVar13;
                              wVar16 = copy_string(a,wVar13,wVar16);
                              bVar42 = wVar16 == L'\0';
                              wVar16 = local_24c;
                              if (!bVar42) {
                                wVar16 = L'\xffffffe2';
                              }
                              goto joined_r0x00155968;
                            }
                          }
                          bVar42 = false;
                          wVar16 = L'\xffffffe2';
                          goto joined_r0x00155968;
                        }
                        prVar28 = (rar5 *)a->format->data;
                        wVar16 = parse_filter_data(a,prVar28,&p->block_flags_u8,
                                                   (uint32_t *)local_1e8);
                        if (((wVar16 == L'\0') &&
                            (wVar16 = parse_filter_data(a,prVar28,&p->block_flags_u8,local_218),
                            wVar16 == L'\0')) &&
                           (wVar16 = read_bits_16(a,prVar28,&p->block_flags_u8,&uStack_282),
                           wVar16 == L'\0')) {
                          uVar24 = uStack_282 >> 0xd;
                          iVar15 = (prVar28->bits).bit_addr + 3;
                          pwVar1 = &(prVar28->bits).in_addr;
                          *pwVar1 = *pwVar1 + (iVar15 >> 3);
                          (prVar28->bits).bit_addr = (byte)iVar15 & 7;
                          if ((short)uStack_282 < 0 || local_218[0] - 0x400001 < 0xffc00003) {
LAB_0015580e:
                            iVar15 = 0x54;
                            pcVar30 = "Invalid filter encountered";
                            uStack_282 = uVar24;
                          }
                          else {
                            lVar26 = (prVar28->cstate).last_block_start;
                            lVar27 = (prVar28->cstate).last_block_length;
                            if ((lVar27 != 0 && lVar26 != 0) &&
                               ((long)((prVar28->cstate).write_ptr + (local_1e8[0] & 0xffffffff)) <
                                lVar27 + lVar26)) goto LAB_0015580e;
                            local_260 = (uint *)CONCAT44(local_260._4_4_,(uint)uStack_282);
                            uStack_282 = uVar24;
                            uStack_268 = (ulong)local_218[0];
                            local_238 = local_1e8[0] & 0xffffffff;
                            puVar20 = (uint *)calloc(1,0x28);
                            if (puVar20 == (uint *)0x0) {
                              puVar20 = (uint *)0x0;
                            }
                            else {
                              uVar7 = (prVar28->cstate).filters.size;
                              uVar8 = (prVar28->cstate).filters.cap_mask;
                              if (uVar8 + 1 != (uint)uVar7) {
                                uVar9 = (prVar28->cstate).filters.end_pos;
                                (prVar28->cstate).filters.arr[uVar9] = (size_t)puVar20;
                                (prVar28->cstate).filters.end_pos = uVar8 & uVar9 + 1;
                                (prVar28->cstate).filters.size = uVar7 + 1;
                              }
                            }
                            if (puVar20 != (uint *)0x0) {
                              *puVar20 = (uint)uVar24;
                              lVar26 = local_238 + (prVar28->cstate).write_ptr;
                              *(long *)(puVar20 + 4) = lVar26;
                              *(ulong *)(puVar20 + 6) = uStack_268;
                              (prVar28->cstate).last_block_start = lVar26;
                              (prVar28->cstate).last_block_length = uStack_268;
                              wVar16 = L'\0';
                              if (((uint)local_260 < 0x2000) &&
                                 (local_260 = puVar20,
                                 wVar16 = read_consume_bits(a,prVar28,&p->block_flags_u8,L'\x05',
                                                            &local_23c), wVar16 == L'\0')) {
                                local_260[1] = local_23c + L'\x01';
                                wVar16 = L'\0';
                              }
                              goto LAB_00155714;
                            }
                            iVar15 = 0xc;
                            pcVar30 = "Can\'t allocate memory for a filter descriptor.";
                          }
                          archive_set_error(&a->archive,iVar15,pcVar30);
                          wVar16 = L'\xffffffe2';
                        }
LAB_00155714:
                        if (wVar16 == L'\0') goto LAB_00155745;
                      }
                      goto LAB_00155d1d;
                    }
                    wVar16 = decode_code_length(a,prVar19,&p->block_flags_u8,local_284 - 0x106);
                    if (wVar16 == L'\xffffffff') {
                      pcVar30 = "Failed to decode the code length";
LAB_00155954:
                      bVar42 = false;
                      archive_set_error(&a->archive,0x16,pcVar30);
                      a = local_280;
                      wVar16 = L'\xffffffe2';
                    }
                    else {
                      puVar20 = (uint *)(ulong)(uint)wVar16;
                      wVar16 = decode_number(a,local_228,&p->block_flags_u8,(uint16_t *)local_218);
                      if (wVar16 != L'\0') {
                        pcVar30 = "Failed to decode the distance slot";
                        goto LAB_00155954;
                      }
                      uVar37 = local_218[0] & 0xffff;
                      wVar13 = L'\0';
                      if (3 < (ushort)local_218[0]) {
                        wVar13 = (uint)((ushort)local_218[0] >> 1) + L'\xffffffff';
                        uVar37 = (local_218[0] & 1 | 2) << ((byte)wVar13 & 0x1f);
                      }
                      wVar38 = uVar37 + L'\x01';
                      local_260 = puVar20;
                      wVar16 = local_24c;
                      if (L'\0' < wVar13) {
                        if (wVar13 < L'\x04') {
                          uStack_268 = CONCAT44(uStack_268._4_4_,wVar38);
                          wVar13 = read_consume_bits(a,prVar19,&p->block_flags_u8,wVar13,
                                                     (wchar_t *)local_1e8);
                          bVar42 = false;
                          wVar38 = L'\0';
                          if (wVar13 == L'\0') {
                            wVar38 = (wchar_t)local_1e8[0];
                          }
                          wVar16 = local_24c;
                          if (wVar13 != L'\0') {
                            wVar16 = wVar13;
                          }
                          a = local_280;
                          if (wVar13 != L'\0') goto joined_r0x00155968;
                          wVar38 = (wchar_t)uStack_268 + wVar38;
                        }
                        else {
                          if (wVar13 == L'\x04') {
                            uStack_268 = CONCAT44(uStack_268._4_4_,wVar38);
LAB_00155bdd:
                            wVar16 = decode_number(a,local_1f8,&p->block_flags_u8,
                                                   (uint16_t *)local_1e8);
                            if (wVar16 == L'\0') {
                              if ((wchar_t)uStack_268 <
                                  (int)(0x7ffffffe - (uint)(uint16_t)local_1e8[0])) {
                                bVar42 = true;
                                wVar38 = (wchar_t)uStack_268 + (uint)(uint16_t)local_1e8[0];
                                wVar16 = local_24c;
                              }
                              else {
                                bVar42 = false;
                                archive_set_error(&local_280->archive,0x54,
                                                  "Distance pointer overflow");
                                wVar16 = L'\xffffffe2';
                                wVar38 = (wchar_t)uStack_268;
                              }
                            }
                            else {
                              bVar42 = false;
                              archive_set_error(&a->archive,0x16,
                                                "Failed to decode the distance slot");
                              wVar38 = (wchar_t)uStack_268;
                              wVar16 = L'\xffffffe2';
                            }
                          }
                          else {
                            uVar34 = (ulong)(prVar19->bits).in_addr;
                            uVar40 = (prVar19->cstate).cur_block_size;
                            if ((long)uVar34 < (long)uVar40) {
                              uVar37 = *(uint *)(&p->block_flags_u8 + uVar34);
                              bVar22 = (prVar19->bits).bit_addr;
                              uVar37 = (uint)((&p[2].block_flags_u8)[uVar34] >> (8 - bVar22 & 0x1f))
                                       | (uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 |
                                          (uVar37 & 0xff00) << 8 | uVar37 << 0x18) <<
                                         (bVar22 & 0x1f);
                              wVar16 = L'\0';
                            }
                            else {
                              uVar37 = 0;
                              uStack_268 = uVar34;
                              local_238 = uVar40;
                              archive_set_error(&local_280->archive,0x16,
                                                "Premature end of stream during extraction of data (#1)"
                                               );
                              wVar16 = L'\xffffffe2';
                              uVar34 = uStack_268;
                              uVar40 = local_238;
                            }
                            if ((long)uVar34 < (long)uVar40) {
                              iVar15 = (prVar19->bits).bit_addr + wVar13 + -4;
                              pwVar1 = &(prVar19->bits).in_addr;
                              *pwVar1 = *pwVar1 + (iVar15 >> 3);
                              (prVar19->bits).bit_addr = (byte)iVar15 & 7;
                              uStack_268 = CONCAT44(uStack_268._4_4_,
                                                    wVar38 + (uVar37 >>
                                                             (0x24U - (char)wVar13 & 0x1f)) * 0x10);
                              a = local_280;
                              goto LAB_00155bdd;
                            }
                            bVar42 = false;
                          }
                          a = local_280;
                          if (!bVar42) {
                            bVar42 = false;
                            goto joined_r0x00155968;
                          }
                        }
                      }
                      if (L'Ā' < wVar38) {
                        if (wVar38 < L'\x2001') {
                          local_260 = (uint *)(ulong)((int)local_260 + 1);
                        }
                        else {
                          local_260 = (uint *)(ulong)((int)local_260 +
                                                      (uint)(L'\x00040000' < wVar38) + 2);
                        }
                      }
                      (prVar19->cstate).dist_cache[3] = (prVar19->cstate).dist_cache[2];
                      *(undefined8 *)((prVar19->cstate).dist_cache + 1) =
                           *(undefined8 *)(prVar19->cstate).dist_cache;
                      (prVar19->cstate).dist_cache[0] = wVar38;
                      (prVar19->cstate).last_len = (wchar_t)local_260;
                      wVar13 = copy_string(a,(wchar_t)local_260,wVar38);
                      bVar42 = wVar13 == L'\0';
                      a = local_280;
                      if (!bVar42) {
                        wVar16 = L'\xffffffe2';
                      }
                    }
joined_r0x00155968:
                    if (!bVar42) goto LAB_00155d1d;
                    local_24c = wVar16;
                  } while ((prVar19->cstate).write_ptr - (prVar19->cstate).last_write_ptr <=
                           (prVar19->cstate).window_size >> 1);
                }
LAB_00155d1a:
                wVar16 = L'\0';
LAB_00155d1d:
                prVar19 = local_278;
                if (wVar16 == L'\0') {
                  bVar22 = *(byte *)&local_278->cstate;
                  if (((bVar22 & 0xc) == 8) &&
                     (lVar26 = (local_278->cstate).cur_block_size, 0 < lVar26)) {
                    iVar21 = __archive_read_consume(a,lVar26);
                    wVar16 = L'\xffffffe2';
                    if (iVar21 == lVar26) {
                      pfVar2 = &prVar19->file;
                      pfVar2->bytes_remaining =
                           pfVar2->bytes_remaining - (prVar19->cstate).cur_block_size;
                      wVar16 = L'\0';
                    }
                  }
                  else {
                    wVar16 = L'\0';
                    if ((bVar22 & 4) != 0) {
                      *(byte *)&local_278->cstate = bVar22 & 0xfb;
                    }
                  }
                }
              }
LAB_00155d22:
              if ((wVar16 == L'\xffffffe2') || (wVar16 == L'\x01')) goto LAB_00155f10;
            } while ((local_220->cstate).last_write_ptr == (local_220->cstate).write_ptr);
          }
          prVar28 = local_220;
          prVar19 = (rar5 *)a->format->data;
          bVar22 = *(byte *)&prVar19->cstate;
          *(byte *)&prVar19->cstate = bVar22 & 0xfd;
          if ((prVar19->cstate).filters.size == 0) {
LAB_00154d4b:
            *(byte *)&prVar19->cstate = bVar22 | 2;
            iVar15 = 0;
          }
          else {
            puVar20 = (uint *)(prVar19->cstate).filters.arr[(prVar19->cstate).filters.beg_pos];
            lVar26 = (prVar19->cstate).write_ptr;
            lVar27 = *(long *)(puVar20 + 4);
            if ((lVar26 <= lVar27) || (lVar26 < *(long *)(puVar20 + 6) + lVar27)) goto LAB_00154d4b;
            lVar26 = (prVar19->cstate).last_write_ptr;
            if (lVar26 == lVar27) {
              rar = (rar5 *)a->format->data;
              free((rar->cstate).filtered_buf);
              local_258 = *(rar5 **)(puVar20 + 6);
              puVar18 = (uint8_t *)malloc((size_t)local_258);
              prVar39 = local_258;
              (rar->cstate).filtered_buf = puVar18;
              if (puVar18 == (uint8_t *)0x0) {
                archive_set_error(&a->archive,0xc,"Can\'t allocate memory for filter data.");
LAB_00156123:
                bVar42 = false;
                iVar15 = -0x1e;
              }
              else {
                uVar37 = *puVar20;
                if (uVar37 - 1 < 2) {
                  pdVar36 = (decode_table *)(rar->cstate).window_buf;
                  uVar40 = (rar->cstate).window_mask;
                  uVar34 = *(long *)(puVar20 + 4) + (rar->cstate).solid_offset;
                  prVar33 = (rar5 *)(uVar34 & uVar40);
                  prVar28 = (rar5 *)((ulong)((long)&local_258->header_initialized + uVar34) & uVar40
                                    );
                  local_270 = (uint8_t *)(ulong)uVar37;
                  if (prVar28 < prVar33) {
                    local_278 = prVar28;
                    local_228 = pdVar36;
                    memcpy(puVar18,(void *)((long)pdVar36->decode_len +
                                           (long)&prVar33[-1].field_0x532c),
                           (uVar40 - (long)prVar33) + 1);
                    puVar18 = puVar18 + (uVar40 - (long)prVar33) + 1;
                    prVar28 = local_278;
                    pdVar36 = local_228;
                  }
                  else {
                    pdVar36 = (decode_table *)
                              ((long)((decode_table *)(pdVar36->decode_len + -1))->decode_len +
                              (long)&prVar33[-1].field_0x532c);
                    prVar28 = local_258;
                  }
                  memcpy(puVar18,pdVar36,(size_t)prVar28);
                  a = local_280;
                  if (4 < (long)prVar39) {
                    puVar18 = local_270;
                    uVar40 = 0;
                    do {
                      lVar26 = (rar->cstate).solid_offset + *(long *)(puVar20 + 4);
                      uVar34 = uVar40 + 1;
                      uVar35 = (rar->cstate).window_mask;
                      uVar29 = (rar->cstate).window_buf[lVar26 + uVar40 & uVar35];
                      if ((uVar29 == 0xe8) || ((int)puVar18 == 2 && uVar29 == 0xe9)) {
                        lVar27 = *(long *)(puVar20 + 4) + uVar34;
                        uVar37 = (uint)lVar27;
                        uVar31 = uVar37 + 0xffffff;
                        if (-1 < lVar27) {
                          uVar31 = uVar37;
                        }
                        iVar15 = uVar37 - (uVar31 & 0xff000000);
                        uVar14 = read_filter_data(rar,(uint)uVar35 & (int)lVar26 + (int)uVar34);
                        if ((int)uVar14 < 0) {
                          if (-1 < (int)(iVar15 + uVar14)) {
                            uVar25 = uVar14 + 0x1000000;
                            goto LAB_001560cd;
                          }
                        }
                        else if ((int)uVar14 < 0x1000000) {
                          uVar14 = uVar14 - iVar15;
                          uVar25 = uVar14;
LAB_001560cd:
                          puVar18 = (rar->cstate).filtered_buf;
                          uVar34 = uVar34 & 0xffffffff;
                          puVar18[uVar34] = (uint8_t)uVar14;
                          puVar18[uVar34 + 1] = (uint8_t)(uVar14 >> 8);
                          puVar18[uVar34 + 2] = (uint8_t)(uVar14 >> 0x10);
                          puVar18[uVar34 + 3] = (uint8_t)(uVar25 >> 0x18);
                        }
                        uVar34 = uVar40 + 5;
                        puVar18 = local_270;
                      }
                      a = local_280;
                      uVar40 = uVar34;
                    } while ((long)uVar34 < *(long *)(puVar20 + 6) + -4);
                  }
                }
                else if (uVar37 == 3) {
                  puVar10 = (rar->cstate).window_buf;
                  uVar40 = (rar->cstate).window_mask;
                  uVar34 = *(long *)(puVar20 + 4) + (rar->cstate).solid_offset;
                  uVar35 = uVar34 & uVar40;
                  uVar34 = (ulong)((long)&local_258->header_initialized + uVar34) & uVar40;
                  if (uVar34 < uVar35) {
                    local_270 = puVar10;
                    memcpy(puVar18,puVar10 + uVar35,(uVar40 - uVar35) + 1);
                    memcpy(puVar18 + (uVar40 - uVar35) + 1,local_270,uVar34);
                    prVar39 = local_258;
                  }
                  else {
                    memcpy(puVar18,puVar10 + uVar35,(size_t)local_258);
                  }
                  a = local_280;
                  if (3 < (long)prVar39) {
                    uVar40 = 0;
                    do {
                      lVar26 = (rar->cstate).solid_offset + *(long *)(puVar20 + 4);
                      uVar34 = (rar->cstate).window_mask;
                      if ((rar->cstate).window_buf[lVar26 + uVar40 + 3 & uVar34] == 0xeb) {
                        uVar14 = read_filter_data(rar,(int)lVar26 + (int)uVar40 & (uint)uVar34);
                        uVar35 = uVar40 + *(long *)(puVar20 + 4);
                        uVar34 = uVar40 + 3 + *(long *)(puVar20 + 4);
                        if (-1 < (long)uVar35) {
                          uVar34 = uVar35;
                        }
                        iVar15 = uVar14 - (int)(uVar34 >> 2);
                        puVar18 = (rar->cstate).filtered_buf;
                        uVar34 = uVar40 & 0xffffffff;
                        puVar18[uVar34] = (uint8_t)iVar15;
                        puVar18[uVar34 + 1] = (uint8_t)((uint)iVar15 >> 8);
                        puVar18[uVar34 + 2] = (uint8_t)((uint)iVar15 >> 0x10);
                        puVar18[uVar34 + 3] = 0xeb;
                      }
                      uVar40 = uVar40 + 4;
                    } while ((long)uVar40 < *(long *)(puVar20 + 6) + -3);
                  }
                }
                else {
                  if (uVar37 != 0) {
                    archive_set_error(&a->archive,0x54,"Unsupported filter type: 0x%x");
                    goto LAB_00156123;
                  }
                  if (0 < (int)puVar20[1]) {
                    lVar26 = 0;
                    lVar27 = 0;
                    do {
                      if (lVar26 < *(long *)(puVar20 + 6)) {
                        uVar29 = '\0';
                        lVar32 = lVar26;
                        do {
                          uVar29 = uVar29 - (rar->cstate).window_buf
                                            [(rar->cstate).solid_offset + *(long *)(puVar20 + 4) +
                                             lVar27 & (rar->cstate).window_mask];
                          (rar->cstate).filtered_buf[lVar32] = uVar29;
                          lVar27 = lVar27 + 1;
                          lVar32 = lVar32 + (int)puVar20[1];
                        } while (lVar32 < *(long *)(puVar20 + 6));
                      }
                      lVar26 = lVar26 + 1;
                    } while (lVar26 < (int)puVar20[1]);
                  }
                }
                wVar16 = push_data_ready(a,rar,(rar->cstate).filtered_buf,*(size_t *)(puVar20 + 6),
                                         (rar->cstate).last_write_ptr);
                bVar42 = wVar16 == L'\0';
                if (bVar42) {
                  piVar4 = &(rar->cstate).last_write_ptr;
                  *piVar4 = *piVar4 + *(long *)(puVar20 + 6);
                  iVar15 = 0;
                  prVar28 = local_220;
                }
                else {
                  archive_set_error(&a->archive,0x16,"Stack overflow when submitting unpacked data")
                  ;
                  iVar15 = -0x1e;
                  prVar28 = local_220;
                }
              }
              a = local_280;
              if (bVar42) {
                uVar12 = (prVar19->cstate).filters.size;
                if (uVar12 != 0) {
                  uVar24 = (prVar19->cstate).filters.beg_pos;
                  puVar20 = (uint *)(prVar19->cstate).filters.arr[uVar24];
                  (prVar19->cstate).filters.beg_pos =
                       uVar24 + 1 & (prVar19->cstate).filters.cap_mask;
                  (prVar19->cstate).filters.size = uVar12 - 1;
                }
                free(puVar20);
                goto LAB_0015626a;
              }
            }
            else {
              push_window_data(a,prVar19,lVar26,lVar27);
LAB_0015626a:
              iVar15 = -10;
            }
          }
          wVar16 = L'\0';
          if (iVar15 != -10) {
            if (iVar15 == -0x1e) goto LAB_00155e10;
            if ((prVar28->cstate).filters.size == 0) {
              lVar26 = (prVar28->cstate).write_ptr;
            }
            else {
              lVar27 = *(long *)((prVar28->cstate).filters.arr[(prVar28->cstate).filters.beg_pos] +
                                0x10);
              lVar26 = (prVar28->cstate).write_ptr;
              if (lVar27 < lVar26) {
                lVar26 = lVar27;
              }
            }
            lVar27 = (prVar28->cstate).last_write_ptr;
            if (lVar26 == lVar27) {
              wVar16 = L'\xfffffff6';
            }
            else {
              push_window_data(a,prVar28,lVar27,lVar26);
              (prVar28->cstate).last_write_ptr = lVar26;
            }
          }
        }
LAB_00155f10:
        paVar11 = local_280;
      } while (wVar16 == L'\xfffffff6');
      goto LAB_00156287;
    }
    if (wVar16 != L'\0') {
      archive_set_error(&a->archive,0x54,"Compression method not supported: 0x%x");
      wVar16 = L'\xffffffe2';
      goto LAB_00156287;
    }
  }
  wVar16 = do_unstore_file(a,local_230,buff,size,offset);
LAB_00156287:
  if (wVar16 != L'\0') {
    return wVar16;
  }
  if ((local_230->file).bytes_remaining != 0) {
    return L'\0';
  }
  if ((local_230->cstate).last_write_ptr == (local_230->file).unpacked_size) {
    puVar3 = &(local_230->file).field_0x20;
    *puVar3 = *puVar3 | 4;
    wVar16 = verify_global_checksums(a);
    return wVar16;
  }
  return L'\0';
}

Assistant:

static int rar5_read_data(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset) {
	int ret;
	struct rar5* rar = get_context(a);

	if (size)
		*size = 0;

	if(rar->file.dir > 0) {
		/* Don't process any data if this file entry was declared
		 * as a directory. This is needed, because entries marked as
		 * directory doesn't have any dictionary buffer allocated, so
		 * it's impossible to perform any decompression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't decompress an entry marked as a directory");
		return ARCHIVE_FAILED;
	}

	if(!rar->skip_mode && (rar->cstate.last_write_ptr > rar->file.unpacked_size)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Unpacker has written too many bytes");
		return ARCHIVE_FATAL;
	}

	ret = use_data(rar, buff, size, offset);
	if(ret == ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.eof == 1) {
		return ARCHIVE_EOF;
	}

	ret = do_unpack(a, rar, buff, size, offset);
	if(ret != ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.bytes_remaining == 0 &&
			rar->cstate.last_write_ptr == rar->file.unpacked_size)
	{
		/* If all bytes of current file were processed, run
		 * finalization.
		 *
		 * Finalization will check checksum against proper values. If
		 * some of the checksums will not match, we'll return an error
		 * value in the last `archive_read_data` call to signal an error
		 * to the user. */

		rar->file.eof = 1;
		return verify_global_checksums(a);
	}

	return ARCHIVE_OK;
}